

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O1

BasicBlock * __thiscall flow::IRHandler::createBlock(IRHandler *this,string *name)

{
  size_t *psVar1;
  BasicBlock *this_00;
  _List_node_base *p_Var2;
  
  this_00 = (BasicBlock *)operator_new(0x98);
  BasicBlock::BasicBlock(this_00,name,this);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->blocks_).
            super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return (BasicBlock *)
         (this->blocks_).
         super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
}

Assistant:

BasicBlock* IRHandler::createBlock(const std::string& name) {
  blocks_.emplace_back(std::make_unique<BasicBlock>(name, this));
  return blocks_.back().get();
}